

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::attachNamesTest(TestContext *testCtx,Context *context)

{
  uint local_20;
  uint local_1c;
  deUint32 reservedRboName;
  deUint32 reservedTexName;
  Context *context_local;
  TestContext *testCtx_local;
  
  _reservedRboName = context;
  context_local = (Context *)testCtx;
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*_reservedRboName->_vptr_Context[7])(_reservedRboName,1,&local_1c);
  logComment((TestContext *)context_local,"Attaching allocated texture name to 2D target");
  (*_reservedRboName->_vptr_Context[0x1e])(_reservedRboName,0x8d40,0x8ce0,0xde1,(ulong)local_1c,0);
  checkError((TestContext *)context_local,_reservedRboName,0x502);
  logComment((TestContext *)context_local,"Attaching allocated texture name to cube target");
  (*_reservedRboName->_vptr_Context[0x1e])(_reservedRboName,0x8d40,0x8ce0,0x8516,(ulong)local_1c,0);
  checkError((TestContext *)context_local,_reservedRboName,0x502);
  (*_reservedRboName->_vptr_Context[0xd])(_reservedRboName,1,&local_20);
  logComment((TestContext *)context_local,"Attaching allocated renderbuffer name");
  (*_reservedRboName->_vptr_Context[0x20])(_reservedRboName,0x8d40,0x8ce0,0x8d41,(ulong)local_20);
  checkError((TestContext *)context_local,_reservedRboName,0x502);
  return;
}

Assistant:

static void attachNamesTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// Just allocate some names, don't bind for storage
	deUint32 reservedTexName;
	context.genTextures(1, &reservedTexName);

	logComment(testCtx, "Attaching allocated texture name to 2D target");
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, reservedTexName, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	logComment(testCtx, "Attaching allocated texture name to cube target");
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, reservedTexName, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	deUint32 reservedRboName;
	context.genRenderbuffers(1, &reservedRboName);

	logComment(testCtx, "Attaching allocated renderbuffer name");
	context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, reservedRboName);
	checkError(testCtx, context, GL_INVALID_OPERATION);
}